

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void super_stats(int nsuper,int *xsup)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int bucket [10];
  uint local_58 [12];
  
  if (nsuper < 0) {
    uVar7 = 0;
    uVar6 = 0;
  }
  else {
    uVar2 = 0;
    uVar6 = 0;
    uVar7 = 0;
    do {
      uVar5 = xsup[uVar2 + 1] - xsup[uVar2];
      uVar2 = uVar2 + 1;
      uVar7 = uVar7 + (uVar5 == 1);
      if ((int)uVar6 <= (int)uVar5) {
        uVar6 = uVar5;
      }
    } while (nsuper + 1 != uVar2);
  }
  printf("    Supernode statistics:\n\tno of super = %d\n",(ulong)(nsuper + 1));
  printf("\tmax supernode size = %d\n",(ulong)uVar6);
  printf("\tno of size 1 supernodes = %d\n",(ulong)uVar7);
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  if (-1 < nsuper) {
    uVar2 = 0;
    do {
      iVar4 = (int)(((float)(xsup[uVar2 + 1] - xsup[uVar2]) / (float)(int)uVar6) * 10.0);
      if (8 < iVar4) {
        iVar4 = 9;
      }
      uVar2 = uVar2 + 1;
      local_58[iVar4] = local_58[iVar4] + 1;
    } while (nsuper + 1 != uVar2);
  }
  puts("\tHistogram of supernode sizes:");
  lVar3 = 0;
  do {
    lVar1 = lVar3 + 1;
    printf("\tsnode: %d-%d\t\t%d\n",
           (ulong)((int)(((float)(int)lVar3 * (float)(int)uVar6) / 10.0) + 1),
           (ulong)(uint)(int)(((float)(int)lVar1 * (float)(int)uVar6) / 10.0),(ulong)local_58[lVar3]
          );
    lVar3 = lVar1;
  } while (lVar1 != 10);
  return;
}

Assistant:

void super_stats(int nsuper, const int *xsup)
{
    register int nsup1 = 0;
    int    i, isize, whichb, bl, bh;
    int    bucket[NBUCKS];
    int    max_sup_size = 0;

    for (i = 0; i <= nsuper; i++) {
	isize = xsup[i+1] - xsup[i];
	if ( isize == 1 ) nsup1++;
	if ( max_sup_size < isize ) max_sup_size = isize;	
    }

    printf("    Supernode statistics:\n\tno of super = %d\n", nsuper+1);
    printf("\tmax supernode size = %d\n", max_sup_size);
    printf("\tno of size 1 supernodes = %d\n", nsup1);

    /* Histogram of the supernode sizes */
    ifill (bucket, NBUCKS, 0);

    for (i = 0; i <= nsuper; i++) {
        isize = xsup[i+1] - xsup[i];
        whichb = (float) isize / max_sup_size * NBUCKS;
        if (whichb >= NBUCKS) whichb = NBUCKS - 1;
        bucket[whichb]++;
    }
    
    printf("\tHistogram of supernode sizes:\n");
    for (i = 0; i < NBUCKS; i++) {
        bl = (float) i * max_sup_size / NBUCKS;
        bh = (float) (i+1) * max_sup_size / NBUCKS;
        printf("\tsnode: %d-%d\t\t%d\n", bl+1, bh, bucket[i]);
    }

}